

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O0

unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> __thiscall
flow::lang::Parser::arrayExpr(Parser *this)

{
  Report *pRVar1;
  bool bVar2;
  Token TVar3;
  LiteralType args;
  LiteralType LVar4;
  SourceLocation *pSVar5;
  reference this_00;
  pointer pEVar6;
  FilePos *endPos;
  Parser *in_RSI;
  undefined1 local_138 [16];
  string local_128;
  allocator<char> local_101;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  reference local_b8;
  unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *e_1;
  iterator __end3;
  iterator __begin3;
  vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
  *__range3;
  undefined1 local_90 [4];
  LiteralType baseType;
  int local_84;
  undefined1 local_80 [8];
  unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> e;
  vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
  fields;
  undefined1 local_50 [8];
  SourceLocation loc;
  Parser *this_local;
  
  pSVar5 = location(in_RSI);
  SourceLocation::SourceLocation((SourceLocation *)local_50,pSVar5);
  nextToken(in_RSI);
  std::
  vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
  ::vector((vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
            *)&e);
  TVar3 = token(in_RSI);
  if (TVar3 != BrClose) {
    expr((Parser *)local_80);
    bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_80);
    if (bVar2) {
      std::
      vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
      ::push_back((vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
                   *)&e,(value_type *)local_80);
      while (bVar2 = consumeIf(in_RSI,Comma), bVar2) {
        expr((Parser *)local_90);
        std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::operator=
                  ((unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)local_80,
                   (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)local_90)
        ;
        std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::~unique_ptr
                  ((unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)local_90)
        ;
        bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_80);
        if (!bVar2) {
          std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>::
          unique_ptr<std::default_delete<flow::lang::Expr>,void>
                    ((unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>> *)this,
                     (nullptr_t)0x0);
          local_84 = 1;
          goto LAB_0015a95c;
        }
        std::
        vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
        ::push_back((vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
                     *)&e,(value_type *)local_80);
      }
      local_84 = 0;
    }
    else {
      std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>::
      unique_ptr<std::default_delete<flow::lang::Expr>,void>
                ((unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>> *)this,
                 (nullptr_t)0x0);
      local_84 = 1;
    }
LAB_0015a95c:
    std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::~unique_ptr
              ((unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)local_80);
    if (local_84 != 0) goto LAB_0015ad93;
  }
  consume(in_RSI,BrClose);
  bVar2 = std::
          vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
          ::empty((vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
                   *)&e);
  if (bVar2) {
    pRVar1 = in_RSI->report_;
    pSVar5 = lastLocation(in_RSI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,"Empty arrays are not allowed. Cannot infer element type.",
               (allocator<char> *)(local_138 + 0xf));
    diagnostics::Report::typeError<>(pRVar1,pSVar5,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator((allocator<char> *)(local_138 + 0xf));
    std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>::
    unique_ptr<std::default_delete<flow::lang::Expr>,void>
              ((unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>> *)this,
               (nullptr_t)0x0);
    local_84 = 1;
  }
  else {
    this_00 = std::
              vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
              ::front((vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
                       *)&e);
    pEVar6 = std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::operator->
                       (this_00);
    args = (*(pEVar6->super_ASTNode)._vptr_ASTNode[3])();
    __end3 = std::
             vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
             ::begin((vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
                      *)&e);
    e_1 = (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)
          std::
          vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
          ::end((vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
                 *)&e);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_*,_std::vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>_>
                                       *)&e_1), bVar2) {
      local_b8 = __gnu_cxx::
                 __normal_iterator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_*,_std::vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>_>
                 ::operator*(&__end3);
      pEVar6 = std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::operator->
                         (local_b8);
      LVar4 = (*(pEVar6->super_ASTNode)._vptr_ASTNode[3])();
      if (LVar4 != args) {
        pRVar1 = in_RSI->report_;
        pSVar5 = lastLocation(in_RSI);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d8,"Mixed element types in array not allowed.",&local_d9);
        diagnostics::Report::typeError<>(pRVar1,pSVar5,&local_d8);
        std::__cxx11::string::~string((string *)&local_d8);
        std::allocator<char>::~allocator(&local_d9);
        std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>::
        unique_ptr<std::default_delete<flow::lang::Expr>,void>
                  ((unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>> *)this,
                   (nullptr_t)0x0);
        local_84 = 1;
        goto LAB_0015ad93;
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_*,_std::vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>_>
      ::operator++(&__end3);
    }
    if ((args - Number < 2) || (args == IPAddress || args == Cidr)) {
      endPos = end(in_RSI);
      pSVar5 = SourceLocation::update((SourceLocation *)local_50,endPos);
      std::
      make_unique<flow::lang::ArrayExpr,flow::SourceLocation&,std::vector<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>,std::allocator<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>>>>
                ((SourceLocation *)local_138,
                 (vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
                  *)pSVar5);
      std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>::
      unique_ptr<flow::lang::ArrayExpr,std::default_delete<flow::lang::ArrayExpr>,void>
                ((unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>> *)this,
                 (unique_ptr<flow::lang::ArrayExpr,_std::default_delete<flow::lang::ArrayExpr>_> *)
                 local_138);
      std::unique_ptr<flow::lang::ArrayExpr,_std::default_delete<flow::lang::ArrayExpr>_>::
      ~unique_ptr((unique_ptr<flow::lang::ArrayExpr,_std::default_delete<flow::lang::ArrayExpr>_> *)
                  local_138);
      local_84 = 1;
    }
    else {
      pRVar1 = in_RSI->report_;
      pSVar5 = lastLocation(in_RSI);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,"Invalid array expression. Element type {} is not allowed.",
                 &local_101);
      diagnostics::Report::typeError<flow::LiteralType>(pRVar1,pSVar5,&local_100,args);
      std::__cxx11::string::~string((string *)&local_100);
      std::allocator<char>::~allocator(&local_101);
      std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>::
      unique_ptr<std::default_delete<flow::lang::Expr>,void>
                ((unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>> *)this,
                 (nullptr_t)0x0);
      local_84 = 1;
    }
  }
LAB_0015ad93:
  std::
  vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
  ::~vector((vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
             *)&e);
  SourceLocation::~SourceLocation((SourceLocation *)local_50);
  return (__uniq_ptr_data<flow::lang::Expr,_std::default_delete<flow::lang::Expr>,_true,_true>)
         (__uniq_ptr_data<flow::lang::Expr,_std::default_delete<flow::lang::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::arrayExpr() {
  SourceLocation loc = location();
  nextToken();  // '['
  std::vector<std::unique_ptr<Expr>> fields;

  if (token() != Token::BrClose) {
    auto e = expr();
    if (!e) return nullptr;

    fields.push_back(std::move(e));

    while (consumeIf(Token::Comma)) {
      e = expr();
      if (!e) return nullptr;

      fields.push_back(std::move(e));
    }
  }

  consume(Token::BrClose);

  if (!fields.empty()) {
    LiteralType baseType = fields.front()->getType();
    for (const auto& e : fields) {
      if (e->getType() != baseType) {
        report_.typeError(lastLocation(),
                          "Mixed element types in array not allowed.");
        return nullptr;
      }
    }

    switch (baseType) {
      case LiteralType::Number:
      case LiteralType::String:
      case LiteralType::IPAddress:
      case LiteralType::Cidr:
        break;
      default:
        report_.typeError(
            lastLocation(),
            "Invalid array expression. Element type {} is not allowed.",
            baseType);
        return nullptr;
    }
  } else {
    report_.typeError(
        lastLocation(),
        "Empty arrays are not allowed. Cannot infer element type.");
    return nullptr;
  }

  return std::make_unique<ArrayExpr>(loc.update(end()), std::move(fields));
}